

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,int number,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  bool bVar2;
  uint uVar3;
  LogMessage *other;
  ulong uVar4;
  undefined1 *puVar5;
  ulong uVar6;
  byte *pbVar7;
  LogFinisher local_61;
  LogMessage local_60;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      target[0] = '\v';
      target[1] = '\x10';
      pbVar7 = target + 2;
      uVar3 = number;
      if (0x7f < (uint)number) {
        do {
          *pbVar7 = (byte)number | 0x80;
          uVar3 = (uint)number >> 7;
          pbVar7 = pbVar7 + 1;
          bVar2 = 0x3fff < (uint)number;
          number = uVar3;
        } while (bVar2);
      }
      *pbVar7 = (byte)uVar3;
      pRVar1 = (this->field_0).repeated_string_value;
      if ((this->field_0xa & 0x10) == 0) {
        pbVar7[1] = 0x1a;
        pbVar7 = pbVar7 + 2;
        uVar4 = (**(code **)((pRVar1->super_RepeatedPtrFieldBase).arena_ + 0x78))(pRVar1);
        if ((uint)uVar4 < 0x80) {
          uVar4 = uVar4 & 0xffffffff;
        }
        else {
          uVar6 = uVar4 & 0xffffffff;
          do {
            uVar3 = (uint)uVar4;
            *pbVar7 = (byte)uVar4 | 0x80;
            uVar4 = uVar6 >> 7;
            pbVar7 = pbVar7 + 1;
            uVar6 = uVar4;
          } while (0x3fff < uVar3);
        }
        *pbVar7 = (byte)uVar4;
        puVar5 = (undefined1 *)
                 (**(code **)((pRVar1->super_RepeatedPtrFieldBase).arena_ + 0x80))
                           (pRVar1,deterministic,pbVar7 + 1);
      }
      else {
        puVar5 = (undefined1 *)
                 (**(code **)((pRVar1->super_RepeatedPtrFieldBase).arena_ + 0x88))
                           (pRVar1,3,deterministic,pbVar7 + 1);
      }
      *puVar5 = 0xc;
      target = puVar5 + 1;
    }
  }
  else {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
               ,0x249);
    other = LogMessage::operator<<(&local_60,"Invalid message set extension.");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
    target = InternalSerializeFieldWithCachedSizesToArray(this,number,deterministic,target);
  }
  return target;
}

Assistant:

uint8*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    int number, bool deterministic, uint8* target) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    GOOGLE_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(number, deterministic,
                                                        target);
  }

  if (is_cleared) return target;

  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    target = lazymessage_value->InternalWriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, deterministic, target);
  } else {
    target = WireFormatLite::InternalWriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, *message_value, deterministic,
        target);
  }
  // End group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}